

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

void ex_dzdetect(expr *expr)

{
  char *local_18;
  char *etype;
  expr *expr_local;
  
  if (expr->exp_error == 0) {
    if ((expr->exp_flags & 7U | 1) == 1) {
      local_18 = "expr";
    }
    else if ((expr->exp_flags & 7U | 2) == 2) {
      local_18 = "expr~";
    }
    else if ((expr->exp_flags & 7U | 4) == 4) {
      local_18 = "fexpr~";
    }
    else {
      post("expr -- ex_dzdetect internal error");
      local_18 = "";
    }
    post("%s divide by zero detected",local_18);
    expr->exp_error = expr->exp_error | 1;
  }
  return;
}

Assistant:

void
ex_dzdetect(struct expr *expr)
{
        char *etype;

        if ((!expr->exp_error) & EE_DZ) {
                if (IS_EXPR(expr))
                        etype = "expr";
                else if (IS_EXPR_TILDE(expr))
                        etype = "expr~";
                else if (IS_FEXPR_TILDE(expr))
                        etype = "fexpr~";
                else {
                        post ("expr -- ex_dzdetect internal error");
                        etype = "";
                }
                post ("%s divide by zero detected", etype);
                expr->exp_error |= EE_DZ;
        }
}